

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::computeRotationAxis
          (DeadReckoningCalculator *this,TMATRIX *curOrientationMatrix)

{
  float fVar1;
  double dVar2;
  KFLOAT32 local_24;
  KFLOAT32 len;
  KFLOAT32 z;
  KFLOAT32 y;
  KFLOAT32 x;
  TMATRIX *curOrientationMatrix_local;
  DeadReckoningCalculator *this_local;
  
  if ((this->m_bQuaxAxisSet & 1U) == 0) {
    z = (KFLOAT32)(curOrientationMatrix->Data[1][2] - curOrientationMatrix->Data[2][1]);
    len = (KFLOAT32)(curOrientationMatrix->Data[2][0] - curOrientationMatrix->Data[0][2]);
    local_24 = (KFLOAT32)(curOrientationMatrix->Data[0][1] - curOrientationMatrix->Data[1][0]);
    dVar2 = std::sqrt((double)(ulong)(uint)((float)local_24 * (float)local_24 +
                                           (float)z * (float)z + (float)len * (float)len));
    fVar1 = SUB84(dVar2,0);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      z = (KFLOAT32)((float)z / fVar1);
      len = (KFLOAT32)((float)len / fVar1);
      local_24 = (KFLOAT32)((float)local_24 / fVar1);
    }
    DATA_TYPE::Vector::SetX(&this->m_quatAxis,z);
    DATA_TYPE::Vector::SetY(&this->m_quatAxis,len);
    DATA_TYPE::Vector::SetZ(&this->m_quatAxis,local_24);
    this->m_bQuaxAxisSet = true;
  }
  return;
}

Assistant:

void DeadReckoningCalculator::computeRotationAxis( const TMATRIX& curOrientationMatrix )
{
    if (!m_bQuaxAxisSet)
    {
        KFLOAT32 x,y,z;
        x = curOrientationMatrix.Data[1][2] - curOrientationMatrix.Data[2][1];
        y = curOrientationMatrix.Data[2][0] - curOrientationMatrix.Data[0][2];
        z = curOrientationMatrix.Data[0][1] - curOrientationMatrix.Data[1][0];

        // normalise
        KFLOAT32 len = sqrt(x * x + y * y + z * z);

        if (len != 0)
        {
            x /= len;
            y /= len;
            z /= len;
        }

        m_quatAxis.SetX(x);
        m_quatAxis.SetY(y);
        m_quatAxis.SetZ(z);

        m_bQuaxAxisSet = true;
    }
}